

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O3

bool __thiscall
draco::EntryValue::GetValue<double>(EntryValue *this,vector<double,_std::allocator<double>_> *value)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  ulong uVar4;
  
  puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((puVar1 == puVar2) || (uVar4 = (long)puVar2 - (long)puVar1, (uVar4 & 7) != 0)) {
    bVar3 = false;
  }
  else {
    std::vector<double,_std::allocator<double>_>::resize(value,uVar4 >> 3);
    if (*(void **)(value + 8) == *(void **)value) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    memcpy(*(void **)value,puVar1,
           (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool GetValue(std::vector<DataTypeT> *value) const {
    if (data_.empty()) {
      return false;
    }
    const size_t data_type_size = sizeof(DataTypeT);
    if (data_.size() % data_type_size != 0) {
      return false;
    }
    value->resize(data_.size() / data_type_size);
    memcpy(&value->at(0), &data_[0], data_.size());
    return true;
  }